

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_points.cpp
# Opt level: O0

void __thiscall
Am_Point_Array_Data::Am_Point_Array_Data(Am_Point_Array_Data *this,int *coords,int num_coords)

{
  int iVar1;
  value_type local_34;
  int local_30;
  XPoint xp;
  int i;
  int size;
  int num_coords_local;
  int *coords_local;
  Am_Point_Array_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_004114e8;
  std::vector<XPoint,_std::allocator<XPoint>_>::vector(&this->points);
  iVar1 = num_coords / 2;
  std::vector<XPoint,_std::allocator<XPoint>_>::reserve(&this->points,(long)iVar1);
  for (local_30 = 0; SBORROW4(local_30,iVar1 * 2) != local_30 + iVar1 * -2 < 0;
      local_30 = local_30 + 2) {
    local_34.x = (short)coords[local_30];
    local_34.y = (short)coords[(long)local_30 + 1];
    std::vector<XPoint,_std::allocator<XPoint>_>::push_back(&this->points,&local_34);
  }
  return;
}

Assistant:

Am_Point_Array_Data::Am_Point_Array_Data(int *coords, int num_coords)
{
  const int size = num_coords / 2;
  points.reserve(size);
  for (int i = 0; i < (2 * size); i += 2) {
    const XPoint xp = {static_cast<short>(coords[i]),
                       static_cast<short>(coords[i + 1])};
    points.push_back(xp);
  }
}